

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

uint8_t xml_parser_peek(xml_parser *parser,size_t n)

{
  ushort **ppuVar1;
  ulong local_28;
  size_t position;
  size_t n_local;
  xml_parser *parser_local;
  
  local_28 = parser->position;
  position = n;
  do {
    if (parser->length <= local_28) {
      return '\0';
    }
    ppuVar1 = __ctype_b_loc();
    if (((*ppuVar1)[(int)(uint)parser->buffer[local_28]] & 0x2000) == 0) {
      if (position == 0) {
        return parser->buffer[local_28];
      }
      position = position - 1;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static uint8_t xml_parser_peek(struct xml_parser* parser, size_t n) {
	size_t position = parser->position;

	while (position < parser->length) {
		if (!isspace(parser->buffer[position])) {
			if (n == 0) {
				return parser->buffer[position];
			} else {
				--n;
			}
		}

		position++;
	}

	return 0;
}